

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O1

void __thiscall OpenMD::RigidBody::setA(RigidBody *this,RotMat3x3d *a,int snapshotNo)

{
  Atom *pAVar1;
  bool bVar2;
  uint i;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  pointer ppAVar5;
  double *pdVar6;
  uint i_1;
  double (*padVar7) [3];
  double (*padVar8) [3];
  long lVar9;
  double *pdVar10;
  uint j_1;
  uint k;
  long lVar11;
  ulong uVar12;
  double dVar13;
  SquareMatrix3<double> result;
  double local_c8 [10];
  double local_78 [9];
  
  iVar3 = (*((this->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
  padVar7 = (double (*) [3])
            ((long)(this->super_StuntDouble).localIndex_ * 0x48 +
            *(long *)(CONCAT44(extraout_var,iVar3) + 0x48 + (this->super_StuntDouble).storage_));
  if ((RotMat3x3d *)padVar7 != a) {
    lVar4 = 0;
    padVar8 = (double (*) [3])a;
    do {
      lVar9 = 0;
      do {
        (((SquareMatrix<double,_3> *)*padVar7)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar9] =
             (((SquareMatrix<double,_3> *)*padVar8)->super_RectMatrix<double,_3U,_3U>).data_[0]
             [lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar4 = lVar4 + 1;
      padVar7 = padVar7 + 1;
      padVar8 = padVar8 + 1;
    } while (lVar4 != 3);
  }
  ppAVar5 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppAVar5) {
    uVar12 = 0;
    do {
      bVar2 = AtomType::isDirectional(ppAVar5[uVar12]->atomType_);
      if (bVar2) {
        padVar7 = (double (*) [3])
                  ((this->refOrients_).
                   super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar12);
        pAVar1 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar12];
        local_78[6] = 0.0;
        local_78[7] = 0.0;
        local_78[4] = 0.0;
        local_78[5] = 0.0;
        local_78[2] = 0.0;
        local_78[3] = 0.0;
        local_78[0] = 0.0;
        local_78[1] = 0.0;
        local_78[8] = 0.0;
        lVar4 = 0;
        pdVar6 = local_78;
        do {
          lVar9 = 0;
          pdVar10 = pdVar6;
          do {
            *pdVar10 = (((SquareMatrix<double,_3> *)*padVar7)->super_RectMatrix<double,_3U,_3U>).
                       data_[0][lVar9];
            lVar9 = lVar9 + 1;
            pdVar10 = pdVar10 + 3;
          } while (lVar9 != 3);
          lVar4 = lVar4 + 1;
          pdVar6 = pdVar6 + 1;
          padVar7 = padVar7 + 1;
        } while (lVar4 != 3);
        local_c8[6] = 0.0;
        local_c8[7] = 0.0;
        local_c8[4] = 0.0;
        local_c8[5] = 0.0;
        local_c8[2] = 0.0;
        local_c8[3] = 0.0;
        local_c8[0] = 0.0;
        local_c8[1] = 0.0;
        local_c8[8] = 0.0;
        lVar4 = 0;
        pdVar6 = local_78;
        do {
          lVar9 = 0;
          padVar7 = (double (*) [3])a;
          do {
            dVar13 = local_c8[lVar4 * 3 + lVar9];
            lVar11 = 0;
            padVar8 = padVar7;
            do {
              dVar13 = dVar13 + pdVar6[lVar11] *
                                (((SquareMatrix<double,_3> *)*padVar8)->
                                super_RectMatrix<double,_3U,_3U>).data_[0][0];
              lVar11 = lVar11 + 1;
              padVar8 = padVar8 + 1;
            } while (lVar11 != 3);
            local_c8[lVar4 * 3 + lVar9] = dVar13;
            lVar9 = lVar9 + 1;
            padVar7 = (double (*) [3])(*padVar7 + 1);
          } while (lVar9 != 3);
          lVar4 = lVar4 + 1;
          pdVar6 = pdVar6 + 3;
        } while (lVar4 != 3);
        (*(pAVar1->super_StuntDouble)._vptr_StuntDouble[4])(pAVar1,local_c8,(ulong)(uint)snapshotNo)
        ;
      }
      uVar12 = (ulong)((int)uVar12 + 1);
      ppAVar5 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(this->atoms_).
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar5 >> 3)
            );
  }
  return;
}

Assistant:

void RigidBody::setA(const RotMat3x3d& a, int snapshotNo) {
    ((snapshotMan_->getSnapshot(snapshotNo))->*storage_).aMat[localIndex_] = a;

    for (unsigned int i = 0; i < atoms_.size(); ++i) {
      if (atoms_[i]->isDirectional()) {
        atoms_[i]->setA(refOrients_[i].transpose() * a, snapshotNo);
      }
    }
  }